

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::ImplicitTrapezoidal
          (ImplicitTrapezoidal *this)

{
  element_type *peVar1;
  undefined8 *in_RDI;
  FixedStepIntegrator *in_stack_ffffffffffffff70;
  
  FixedStepIntegrator::FixedStepIntegrator(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__ImplicitTrapezoidal_003fb368;
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0xb));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0xf));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x13));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x18));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x1d));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x22));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x27));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x2c));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x31));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x36));
  iDynTree::MatrixDynSize::MatrixDynSize((MatrixDynSize *)(in_RDI + 0x3b));
  iDynTree::VectorDynSize::VectorDynSize((VectorDynSize *)(in_RDI + 0x40));
  *(undefined1 *)(in_RDI + 0x44) = 0;
  *(undefined1 *)((long)in_RDI + 0x221) = 0;
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::vector((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
            *)0x38d8c9);
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::vector((vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
            *)0x38d8e2);
  *(undefined1 *)(in_RDI + 0x4b) = 0;
  *(undefined1 *)((long)in_RDI + 0x259) = 0;
  *(undefined1 *)((long)in_RDI + 0x25a) = 0;
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
         *)0x38d910);
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
         *)0x38d929);
  std::
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::map((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
         *)0x38d942);
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38d953);
  std::__cxx11::string::operator=((string *)peVar1,"ImplicitTrapezoidal");
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38d975);
  peVar1->isExplicit = false;
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x38d98a);
  peVar1->numberOfStages = 1;
  return;
}

Assistant:

ImplicitTrapezoidal::ImplicitTrapezoidal()
            {
                m_infoData->name = "ImplicitTrapezoidal";
                m_infoData->isExplicit = false;
                m_infoData->numberOfStages = 1;
            }